

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_size(connectdata *conn)

{
  CURLcode CVar1;
  ftp_conn *ftpc;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  
  if ((*(int *)((long)(conn->data->req).protop + 0x28) == 1) &&
     ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s",(conn->proto).ftpc.file);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    _state(conn,FTP_SIZE);
    ftp._4_4_ = CURLE_OK;
  }
  else {
    ftp._4_4_ = ftp_state_rest(conn);
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_size(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer == FTPTRANSFER_INFO) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* we know ftpc->file is a valid pointer to a file name */
    PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);

    state(conn, FTP_SIZE);
  }
  else
    result = ftp_state_rest(conn);

  return result;
}